

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_> * __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool,_bool,_int>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>::Clone
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this)

{
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this_00;
  
  this_00 = (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *)
            operator_new(0x80);
  IteratorImpl(this_00,this);
  return &this_00->
          super_ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>;
}

Assistant:

ParamIteratorInterface<ParamType>* Clone() const override {
      return new IteratorImpl(*this);
    }